

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

void __thiscall helics::helicsCLI11App::addSystemInfoCall(helicsCLI11App *this)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"--system",&local_69);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:152:13)>
             ::_M_invoke;
  local_58 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:152:13)>
             ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"display system information details",&local_6a);
  CLI::App::add_flag_callback(&this->super_App,&local_28,(function<void_()> *)&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void addSystemInfoCall()
    {
        add_flag_callback(
            "--system",
            []() {
                std::cout << systemInfo() << std::endl;
                throw CLI::Success{};
            },
            "display system information details");
    }